

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator_stress_test.cpp
# Opt level: O3

void __thiscall
density_tests::allocator_stress_test::Impl::run(Impl *this,ThreadData *i_data,uint64_t i_cpu_index)

{
  mutex *__mutex;
  double dVar1;
  double dVar2;
  bool bVar3;
  ThreadData *pTVar4;
  int iVar5;
  microseconds mVar6;
  int *piVar7;
  long lVar8;
  void *pvVar9;
  void *pvVar10;
  size_t index;
  long *in_FS_OFFSET;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  undefined1 auVar14 [16];
  double dVar15;
  void *new_page;
  page_warehouse warehouse;
  EasyRandom rand;
  timespec local_1428;
  page_warehouse local_1418;
  PageAllocator<density::detail::SystemPageManager<65536UL>_> *local_13f0;
  Impl *local_13e8;
  ThreadData *local_13e0;
  long local_13d8;
  ulong local_13d0;
  long local_13c8;
  EasyRandom local_13c0;
  
  set_thread_affinity(1L << ((byte)i_cpu_index & 0x3f));
  set_thread_priority(critical);
  EasyRandom::EasyRandom(&local_13c0);
  local_1418.m_timeout.__r = (this->m_config).m_allocation_timeout.__r * 1000;
  local_1418.m_allocated_pages.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1418.m_allocated_pages.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (void **)0x0;
  local_1418.m_allocated_pages.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (void **)0x0;
  local_1418.m_max_pages = (this->m_config).m_max_memory_per_cpu / 0xfff0;
  __mutex = &(this->m_started_threads).m_mutex;
  iVar5 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar5 != 0) {
    std::__throw_system_error(iVar5);
  }
  (this->m_started_threads).m_counter = (this->m_started_threads).m_counter + 1;
  std::condition_variable::notify_all();
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  if (((this->m_should_exit)._M_base._M_i & 1U) == 0) {
    local_13f0 = (PageAllocator<density::detail::SystemPageManager<65536UL>_> *)
                 (*in_FS_OFFSET + -0xc0);
    uVar12 = 0;
    local_13e8 = this;
    local_13e0 = i_data;
    do {
      pTVar4 = local_13e0;
      mVar6 = random_duration(&local_13c0,(local_13e8->m_config).m_min_wait.__r,
                              (local_13e8->m_config).m_max_wait.__r);
      dVar2 = (double)mVar6.__r * 1e-06;
      dVar1 = (pTVar4->m_inactivity_time).m_min;
      dVar15 = (pTVar4->m_inactivity_time).m_max;
      uVar11 = -(ulong)(dVar2 < dVar1);
      uVar13 = -(ulong)(dVar15 < dVar2);
      (pTVar4->m_inactivity_time).m_min = (double)(~uVar11 & (ulong)dVar1 | (ulong)dVar2 & uVar11);
      (pTVar4->m_inactivity_time).m_max = (double)(~uVar13 & (ulong)dVar15 | (ulong)dVar2 & uVar13);
      dVar1 = (pTVar4->m_inactivity_time).m_average;
      dVar15 = (pTVar4->m_inactivity_time).m_count + 1.0;
      (pTVar4->m_inactivity_time).m_average = (dVar2 - dVar1) / dVar15 + dVar1;
      (pTVar4->m_inactivity_time).m_count = dVar15;
      (pTVar4->m_inactivity_time).m_sum = dVar2 + (pTVar4->m_inactivity_time).m_sum;
      if (0 < mVar6.__r) {
        local_1428.tv_sec = (ulong)mVar6.__r / 1000000;
        local_1428.tv_nsec = ((ulong)mVar6.__r % 1000000) * 1000;
        do {
          iVar5 = nanosleep(&local_1428,&local_1428);
          if (iVar5 != -1) break;
          piVar7 = __errno_location();
        } while (*piVar7 == 4);
      }
      local_13d8 = std::chrono::_V2::steady_clock::now();
      local_13d0 = uVar12;
      if ((uVar12 & 1) == 0) {
        local_13c8 = std::chrono::_V2::steady_clock::now();
        bVar3 = false;
        while( true ) {
          if (bVar3) {
            density::detail::PageAllocator<density::detail::SystemPageManager<65536ul>>::t_instance
            ::__tls_init();
            pvVar9 = density::detail::PageAllocator<density::detail::SystemPageManager<65536UL>_>::
                     try_allocate_page<(density::detail::page_allocation_type)0>
                               (local_13f0,progress_blocking);
          }
          else {
            density::detail::PageAllocator<density::detail::SystemPageManager<65536ul>>::t_instance
            ::__tls_init();
            pvVar9 = density::detail::PageAllocator<density::detail::SystemPageManager<65536UL>_>::
                     try_allocate_page<(density::detail::page_allocation_type)1>
                               (local_13f0,progress_blocking);
          }
          local_1428.tv_sec = (__time_t)pvVar9;
          if (pvVar9 == (void *)0x0) break;
          lVar8 = 0;
          pvVar10 = pvVar9;
          do {
            if ((!bVar3) && (*(long *)((long)pvVar9 + lVar8 * 8) != 0)) {
              detail::assert_failed<>
                        ("words[index] == 0",
                         "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/test_framework/allocator_stress_test.cpp"
                         ,0x5a);
              pvVar10 = (void *)local_1428.tv_sec;
            }
            *(void **)((long)pvVar9 + lVar8 * 8) = pvVar10;
            lVar8 = lVar8 + 1;
          } while (lVar8 != 0x1ffe);
          if (local_1418.m_allocated_pages.super__Vector_base<void_*,_std::allocator<void_*>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              local_1418.m_allocated_pages.super__Vector_base<void_*,_std::allocator<void_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<void*,std::allocator<void*>>::_M_realloc_insert<void*const&>
                      ((vector<void*,std::allocator<void*>> *)&local_1418,
                       (iterator)
                       local_1418.m_allocated_pages.
                       super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                       super__Vector_impl_data._M_finish,(void **)&local_1428);
          }
          else {
            *local_1418.m_allocated_pages.super__Vector_base<void_*,_std::allocator<void_*>_>.
             _M_impl.super__Vector_impl_data._M_finish = pvVar10;
            local_1418.m_allocated_pages.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl
            .super__Vector_impl_data._M_finish =
                 local_1418.m_allocated_pages.super__Vector_base<void_*,_std::allocator<void_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish + 1;
          }
          lVar8 = std::chrono::_V2::steady_clock::now();
          if ((local_1418.m_timeout.__r <= lVar8 - local_13c8) ||
             (bVar3 = (bool)(bVar3 ^ 1),
             local_1418.m_max_pages <=
             (ulong)((long)local_1418.m_allocated_pages.
                           super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)local_1418.m_allocated_pages.
                           super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                           super__Vector_impl_data._M_start >> 3))) break;
        }
      }
      else {
        lVar8 = ((ulong)((long)local_1418.m_allocated_pages.
                               super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)local_1418.m_allocated_pages.
                              super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 3) * 0xfff0;
        auVar14._8_4_ = (int)((ulong)lVar8 >> 0x20);
        auVar14._0_8_ = lVar8;
        auVar14._12_4_ = 0x45300000;
        dVar2 = ((auVar14._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0)) *
                9.5367431640625e-07;
        dVar1 = (pTVar4->m_used_memory).m_min;
        dVar15 = (pTVar4->m_used_memory).m_max;
        uVar12 = -(ulong)(dVar2 < dVar1);
        uVar11 = -(ulong)(dVar15 < dVar2);
        (pTVar4->m_used_memory).m_min = (double)(~uVar12 & (ulong)dVar1 | (ulong)dVar2 & uVar12);
        (pTVar4->m_used_memory).m_max = (double)(~uVar11 & (ulong)dVar15 | (ulong)dVar2 & uVar11);
        dVar1 = (pTVar4->m_used_memory).m_average;
        dVar15 = (pTVar4->m_used_memory).m_count + 1.0;
        (pTVar4->m_used_memory).m_average = (dVar2 - dVar1) / dVar15 + dVar1;
        (pTVar4->m_used_memory).m_count = dVar15;
        (pTVar4->m_used_memory).m_sum = dVar2 + (pTVar4->m_used_memory).m_sum;
        anon_unknown_5::page_warehouse::deallocation_loop(&local_1418);
      }
      uVar12 = local_13d0 ^ 1;
      lVar8 = std::chrono::_V2::steady_clock::now();
      dVar2 = (double)(lVar8 - local_13d8) * 1e-09;
      dVar1 = (local_13e0->m_activity_time).m_min;
      dVar15 = (local_13e0->m_activity_time).m_max;
      uVar11 = -(ulong)(dVar2 < dVar1);
      uVar13 = -(ulong)(dVar15 < dVar2);
      (local_13e0->m_activity_time).m_min = (double)(~uVar11 & (ulong)dVar1 | (ulong)dVar2 & uVar11)
      ;
      (local_13e0->m_activity_time).m_max =
           (double)(~uVar13 & (ulong)dVar15 | (ulong)dVar2 & uVar13);
      dVar1 = (local_13e0->m_activity_time).m_average;
      dVar15 = (local_13e0->m_activity_time).m_count + 1.0;
      (local_13e0->m_activity_time).m_average = (dVar2 - dVar1) / dVar15 + dVar1;
      (local_13e0->m_activity_time).m_count = dVar15;
      (local_13e0->m_activity_time).m_sum = dVar2 + (local_13e0->m_activity_time).m_sum;
    } while (((local_13e8->m_should_exit)._M_base._M_i & 1U) == 0);
  }
  anon_unknown_5::page_warehouse::~page_warehouse(&local_1418);
  return;
}

Assistant:

void run(ThreadData & i_data, uint64_t i_cpu_index)
        {
            set_thread_affinity(uint64_t(1) << i_cpu_index);
            set_thread_priority(thread_priority::critical);
            EasyRandom rand;

            page_warehouse warehouse(m_config.m_max_memory_per_cpu, m_config.m_allocation_timeout);

            m_started_threads.increment();

            auto micro_to_seconds = [](std::chrono::microseconds i_microseconds) {
                double const mult = 1. / (1000. * 1000.);
                return static_cast<double>(i_microseconds.count()) * mult;
            };

            auto nano_to_seconds = [](std::chrono::nanoseconds i_nanoseconds) {
                double const mult = 1. / (1000. * 1000. * 1000.);
                return static_cast<double>(i_nanoseconds.count()) * mult;
            };

            bool should_allocate = false;
            while (!m_should_exit.load())
            {
                auto const wait_duration =
                  random_duration(rand, m_config.m_min_wait, m_config.m_max_wait);

                i_data.m_inactivity_time.sample(micro_to_seconds(wait_duration));

                std::this_thread::sleep_for(wait_duration);

                auto const activity_start = std::chrono::steady_clock::now();

                should_allocate = !should_allocate;
                if (should_allocate)
                {
                    warehouse.allocation_loop();
                }
                else
                {
                    double const bytes_to_mb = 1. / (1024. * 1024.);
                    i_data.m_used_memory.sample(warehouse.allocated_memory() * bytes_to_mb);
                    warehouse.deallocation_loop();
                }

                auto const activity_duration = std::chrono::steady_clock::now() - activity_start;

                i_data.m_activity_time.sample(nano_to_seconds(activity_duration));
            }
        }